

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TextureWrapCase::TextureWrapCase
          (TextureWrapCase *this,TestContext *testCtx,RenderContext *renderCtx,ContextInfo *ctxInfo,
          char *name,char *description,deUint32 wrapS,deUint32 wrapT,deUint32 minFilter,
          deUint32 magFilter,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *filenames)

{
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TextureWrapCase_01e1c610;
  this->m_renderCtx = renderCtx;
  this->m_renderCtxInfo = ctxInfo;
  this->m_format = 0;
  this->m_dataType = 0;
  this->m_wrapS = wrapS;
  this->m_wrapT = wrapT;
  this->m_minFilter = minFilter;
  this->m_magFilter = magFilter;
  this->m_width = 0;
  this->m_height = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_filenames,filenames);
  this->m_texture = (Texture2D *)0x0;
  deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
            (&this->m_renderer,renderCtx,testCtx->m_log,GLSL_VERSION_100_ES,PRECISION_MEDIUMP);
  return;
}

Assistant:

TextureWrapCase::TextureWrapCase (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const glu::ContextInfo& ctxInfo, const char* name, const char* description, deUint32 wrapS, deUint32 wrapT, deUint32 minFilter, deUint32 magFilter, const std::vector<std::string>& filenames)
	: TestCase			(testCtx, name, description)
	, m_renderCtx		(renderCtx)
	, m_renderCtxInfo	(ctxInfo)
	, m_format			(GL_NONE)
	, m_dataType		(GL_NONE)
	, m_wrapS			(wrapS)
	, m_wrapT			(wrapT)
	, m_minFilter		(minFilter)
	, m_magFilter		(magFilter)
	, m_width			(0)
	, m_height			(0)
	, m_filenames		(filenames)
	, m_texture			(DE_NULL)
	, m_renderer		(renderCtx, testCtx.getLog(), glu::GLSL_VERSION_100_ES, glu::PRECISION_MEDIUMP)
{
}